

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<7UL>
mserialize::cx_strcat<1ul,1ul,1ul,1ul,2ul,1ul>
          (cx_string<1UL> *strings,cx_string<1UL> *strings_1,cx_string<1UL> *strings_2,
          cx_string<1UL> *strings_3,cx_string<2UL> *strings_4,cx_string<1UL> *strings_5)

{
  char *pcVar1;
  cx_string<7UL> cVar2;
  long lVar3;
  ulong uVar4;
  char buffer [8];
  ulong auStack_88 [9];
  cx_string<1UL> *local_40 [4];
  cx_string<2UL> *local_20;
  cx_string<1UL> *local_18;
  cx_string<7UL> local_10;
  
  pcVar1 = buffer;
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  local_40[0] = strings;
  local_40[1] = strings_1;
  local_40[2] = strings_2;
  local_40[3] = strings_3;
  local_20 = strings_4;
  local_18 = strings_5;
  auStack_88[1] = 1;
  auStack_88[2] = 1;
  auStack_88[3] = 1;
  auStack_88[4] = 1;
  auStack_88[5] = 2;
  auStack_88[6] = 1;
  for (lVar3 = 1; lVar3 != 7; lVar3 = lVar3 + 1) {
    for (uVar4 = 0; uVar4 < auStack_88[lVar3]; uVar4 = uVar4 + 1) {
      pcVar1[uVar4] = local_40[lVar3 + -1]->_data[uVar4];
    }
    pcVar1 = pcVar1 + uVar4;
  }
  cx_string<7UL>::cx_string(&local_10,buffer);
  cVar2._data[0] = local_10._data[0];
  cVar2._data[1] = local_10._data[1];
  cVar2._data[2] = local_10._data[2];
  cVar2._data[3] = local_10._data[3];
  cVar2._data[4] = local_10._data[4];
  cVar2._data[5] = local_10._data[5];
  cVar2._data[6] = local_10._data[6];
  cVar2._data[7] = local_10._data[7];
  return (cx_string<7UL>)cVar2._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}